

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

int maxdirfiltered<btVector3>
              (btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  btScalar *pbVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < count) {
    pbVar1 = p->m_floats + 2;
    iVar2 = -1;
    uVar3 = 0;
    do {
      if ((allow->m_data[uVar3] != 0) &&
         ((iVar2 == -1 ||
          (p[iVar2].m_floats[2] * dir->m_floats[2] +
           p[iVar2].m_floats[1] * dir->m_floats[1] + p[iVar2].m_floats[0] * dir->m_floats[0] <
           *pbVar1 * dir->m_floats[2] +
           pbVar1[-1] * dir->m_floats[1] +
           ((btVector3 *)(pbVar1 + -2))->m_floats[0] * dir->m_floats[0])))) {
        iVar2 = (int)uVar3;
      }
      uVar3 = uVar3 + 1;
      pbVar1 = pbVar1 + 4;
    } while ((uint)count != uVar3);
    return iVar2;
  }
  return -1;
}

Assistant:

int maxdirfiltered(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	btAssert(count);
	int m=-1;
	for(int i=0;i<count;i++) 
		if(allow[i])
		{
			if(m==-1 || btDot(p[i],dir)>btDot(p[m],dir))
				m=i;
		}
	btAssert(m!=-1);
	return m;
}